

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clip.cpp
# Opt level: O0

bool clip_image_load_from_file(char *fname,clip_image_u8 *img)

{
  clip_image_u8 *img_00;
  int *in_RSI;
  int *in_RDI;
  stbi_uc *data;
  int nc;
  int ny;
  int nx;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  int *in_stack_ffffffffffffffe0;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  img_00 = (clip_image_u8 *)
           stbi_load((char *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI,
                     in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc);
  if (img_00 == (clip_image_u8 *)0x0) {
    if ((int)g_logger_state.verbosity_thold < 5) {
      clip_log_internal(GGML_LOG_LEVEL_ERROR,"%s: failed to load image \'%s\'\n",
                        "clip_image_load_from_file",in_RDI);
    }
    bVar1 = false;
  }
  else {
    clip_build_img_from_pixels
              ((uchar *)in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,
               in_stack_ffffffffffffffd8,img_00);
    stbi_image_free((void *)0x19fc85);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool clip_image_load_from_file(const char * fname, clip_image_u8 * img) {
    int nx, ny, nc;
    auto * data = stbi_load(fname, &nx, &ny, &nc, 3);
    if (!data) {
        LOG_ERR("%s: failed to load image '%s'\n", __func__, fname);
        return false;
    }
    clip_build_img_from_pixels(data, nx, ny, img);
    stbi_image_free(data);
    return true;
}